

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

void __thiscall ArmParser::parseSign(ArmParser *this,Parser *parser,bool *dest)

{
  Token *pTVar1;
  
  pTVar1 = Parser::peekToken(parser,0);
  if (pTVar1->type == Minus) {
    *dest = false;
  }
  else {
    if (pTVar1->type != Plus) {
      *dest = true;
      return;
    }
    *dest = true;
  }
  Parser::eatToken(parser);
  return;
}

Assistant:

void ArmParser::parseSign(Parser& parser, bool& dest)
{
	switch (parser.peekToken().type)
	{
	case TokenType::Plus:
		dest = true;
		parser.eatToken();
		break;
	case TokenType::Minus:
		dest = false;
		parser.eatToken();
		break;
	default:
		dest = true;
		break;
	}
}